

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gnuplot-iostream.h
# Opt level: O3

size_t gnuplotio::
       get_range_size<gnuplotio::VecOfRange<gnuplotio::IteratorRange<__gnu_cxx::__normal_iterator<std::pair<double,int>const*,std::vector<std::pair<double,int>,std::allocator<std::pair<double,int>>>>,std::pair<double,int>>>>
                 (VecOfRange<gnuplotio::IteratorRange<__gnu_cxx::__normal_iterator<const_std::pair<double,_int>_*,_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>,_std::pair<double,_int>_>_>
                  *arg)

{
  bool bVar1;
  pointer pIVar2;
  long lVar3;
  size_t sVar4;
  VecOfRange<gnuplotio::IteratorRange<__gnu_cxx::__normal_iterator<const_std::pair<double,_int>_*,_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>,_std::pair<double,_int>_>_>
  i;
  VecOfRange<gnuplotio::IteratorRange<__gnu_cxx::__normal_iterator<const_std::pair<double,_int>_*,_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>,_std::pair<double,_int>_>_>
  local_28;
  
  std::
  vector<gnuplotio::IteratorRange<__gnu_cxx::__normal_iterator<const_std::pair<double,_int>_*,_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>,_std::pair<double,_int>_>,_std::allocator<gnuplotio::IteratorRange<__gnu_cxx::__normal_iterator<const_std::pair<double,_int>_*,_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>,_std::pair<double,_int>_>_>_>
  ::vector(&local_28.rvec,&arg->rvec);
  sVar4 = 0;
  while (bVar1 = VecOfRange<gnuplotio::IteratorRange<__gnu_cxx::__normal_iterator<const_std::pair<double,_int>_*,_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>,_std::pair<double,_int>_>_>
                 ::is_end(&local_28), !bVar1) {
    sVar4 = sVar4 + 1;
    if ((long)local_28.rvec.
              super__Vector_base<gnuplotio::IteratorRange<__gnu_cxx::__normal_iterator<const_std::pair<double,_int>_*,_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>,_std::pair<double,_int>_>,_std::allocator<gnuplotio::IteratorRange<__gnu_cxx::__normal_iterator<const_std::pair<double,_int>_*,_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>,_std::pair<double,_int>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)local_28.rvec.
              super__Vector_base<gnuplotio::IteratorRange<__gnu_cxx::__normal_iterator<const_std::pair<double,_int>_*,_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>,_std::pair<double,_int>_>,_std::allocator<gnuplotio::IteratorRange<__gnu_cxx::__normal_iterator<const_std::pair<double,_int>_*,_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>,_std::pair<double,_int>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start != 0) {
      lVar3 = (long)local_28.rvec.
                    super__Vector_base<gnuplotio::IteratorRange<__gnu_cxx::__normal_iterator<const_std::pair<double,_int>_*,_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>,_std::pair<double,_int>_>,_std::allocator<gnuplotio::IteratorRange<__gnu_cxx::__normal_iterator<const_std::pair<double,_int>_*,_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>,_std::pair<double,_int>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)local_28.rvec.
                    super__Vector_base<gnuplotio::IteratorRange<__gnu_cxx::__normal_iterator<const_std::pair<double,_int>_*,_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>,_std::pair<double,_int>_>,_std::allocator<gnuplotio::IteratorRange<__gnu_cxx::__normal_iterator<const_std::pair<double,_int>_*,_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>,_std::pair<double,_int>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 4;
      lVar3 = lVar3 + (ulong)(lVar3 == 0);
      pIVar2 = local_28.rvec.
               super__Vector_base<gnuplotio::IteratorRange<__gnu_cxx::__normal_iterator<const_std::pair<double,_int>_*,_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>,_std::pair<double,_int>_>,_std::allocator<gnuplotio::IteratorRange<__gnu_cxx::__normal_iterator<const_std::pair<double,_int>_*,_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>,_std::pair<double,_int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      do {
        (pIVar2->it)._M_current = (pIVar2->it)._M_current + 1;
        pIVar2 = pIVar2 + 1;
        lVar3 = lVar3 + -1;
      } while (lVar3 != 0);
    }
  }
  if (local_28.rvec.
      super__Vector_base<gnuplotio::IteratorRange<__gnu_cxx::__normal_iterator<const_std::pair<double,_int>_*,_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>,_std::pair<double,_int>_>,_std::allocator<gnuplotio::IteratorRange<__gnu_cxx::__normal_iterator<const_std::pair<double,_int>_*,_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>,_std::pair<double,_int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_28.rvec.
                    super__Vector_base<gnuplotio::IteratorRange<__gnu_cxx::__normal_iterator<const_std::pair<double,_int>_*,_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>,_std::pair<double,_int>_>,_std::allocator<gnuplotio::IteratorRange<__gnu_cxx::__normal_iterator<const_std::pair<double,_int>_*,_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>,_std::pair<double,_int>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_28.rvec.
                          super__Vector_base<gnuplotio::IteratorRange<__gnu_cxx::__normal_iterator<const_std::pair<double,_int>_*,_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>,_std::pair<double,_int>_>,_std::allocator<gnuplotio::IteratorRange<__gnu_cxx::__normal_iterator<const_std::pair<double,_int>_*,_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>,_std::pair<double,_int>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_28.rvec.
                          super__Vector_base<gnuplotio::IteratorRange<__gnu_cxx::__normal_iterator<const_std::pair<double,_int>_*,_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>,_std::pair<double,_int>_>,_std::allocator<gnuplotio::IteratorRange<__gnu_cxx::__normal_iterator<const_std::pair<double,_int>_*,_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>,_std::pair<double,_int>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return sVar4;
}

Assistant:

size_t get_range_size(const T &arg) {
    // FIXME - not the fastest way.  Implement a size() method for range.
    size_t ret = 0;
    for(T i=arg; !i.is_end(); i.inc()) ++ret;
    return ret;
}